

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

void proof_chain_resolve(sat_solver2 *s,clause *cls,int Var)

{
  int iVar1;
  clause *pcVar2;
  Int2_Man_t *p;
  Prf_Man_t *p_00;
  
  if (s->fProofLogging != 0) {
    p = s->pInt2;
    if (p != (Int2_Man_t *)0x0) {
      pcVar2 = cls;
      if (cls == (clause *)0x0) {
        pcVar2 = var_unit_clause(s,Var);
        p = s->pInt2;
      }
      iVar1 = Int2_ManChainResolve(p,pcVar2,s->tempInter,(uint)s->vi[Var] >> 1 & 1);
      s->tempInter = iVar1;
    }
    p_00 = s->pPrf2;
    if (p_00 != (Prf_Man_t *)0x0) {
      pcVar2 = cls;
      if (cls == (clause *)0x0) {
        pcVar2 = var_unit_clause(s,Var);
        p_00 = s->pPrf2;
      }
      Prf_ManChainResolve(p_00,pcVar2);
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      if (cls == (clause *)0x0) {
        cls = var_unit_clause(s,Var);
      }
      iVar1 = clause2_proofid(s,cls,(uint)s->vi[Var] >> 1 & 1);
      if (3 < iVar1) {
        veci_push(&s->temp_proof,iVar1);
        return;
      }
      __assert_fail("(ProofId >> 2) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver2.c"
                    ,0xcd,"void proof_chain_resolve(sat_solver2 *, clause *, int)");
    }
  }
  return;
}

Assistant:

static inline void proof_chain_resolve( sat_solver2* s, clause* cls, int Var )
{
    if ( !s->fProofLogging )
        return;
    if ( s->pInt2 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        s->tempInter = Int2_ManChainResolve( s->pInt2, c, s->tempInter, var_is_partA(s,Var) );
    }
    if ( s->pPrf2 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        Prf_ManChainResolve( s->pPrf2, c );
    }
    if ( s->pPrf1 )
    {
        clause* c = cls ? cls : var_unit_clause( s, Var );
        int ProofId = clause2_proofid(s, c, var_is_partA(s,Var));
        assert( (ProofId >> 2) > 0 );
        veci_push( &s->temp_proof, ProofId );
    }
}